

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_6::TraverseRec<tinyusdz::SkelRoot>
               (string *path_prefix,Prim *prim,uint32_t depth,
               PathPrimMap<tinyusdz::SkelRoot> *itemmap)

{
  vtable_type *pvVar1;
  pointer pPVar2;
  bool bVar3;
  uint32_t uVar4;
  SkelRoot *pSVar5;
  mapped_type *ppSVar6;
  Prim *child;
  pointer prim_00;
  bool bVar7;
  string prim_abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (depth < 0x20001) {
    ::std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     path_prefix,"/");
    Path::full_path_name_abi_cxx11_(&local_70,&prim->_path);
    ::std::operator+(&local_90,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70)
    ;
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    pvVar1 = (prim->_data).v_.vtable;
    if (pvVar1 != (vtable_type *)0x0) {
      uVar4 = (*pvVar1->type_id)();
      if (uVar4 == 0x2001) {
        pSVar5 = Prim::as<tinyusdz::SkelRoot>(prim);
        if (pSVar5 != (SkelRoot *)0x0) {
          ppSVar6 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::SkelRoot_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::SkelRoot_*>_>_>
                    ::operator[](itemmap,(key_type *)&local_90);
          *ppSVar6 = pSVar5;
        }
      }
    }
    prim_00 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar2 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar7 = prim_00 == pPVar2;
      if (bVar7) break;
      bVar3 = TraverseRec<tinyusdz::SkelRoot>((string *)&local_90,prim_00,depth + 1,itemmap);
      prim_00 = prim_00 + 1;
    } while (bVar3);
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool TraverseRec(const std::string &path_prefix, const tinyusdz::Prim &prim,
                 uint32_t depth, PathPrimMap<T> &itemmap) {
  if (depth > 1024 * 128) {
    // Too deep
    return false;
  }

  std::string prim_abs_path =
      path_prefix + "/" + prim.local_path().full_path_name();

  if (prim.is<T>()) {
    if (const T *pv = prim.as<T>()) {
      DCOUT("Path : <" << prim_abs_path << "> is " << tinyusdz::value::TypeTraits<T>::type_name());
      itemmap[prim_abs_path] = pv;
    }
  }

  for (const auto &child : prim.children()) {
    if (!TraverseRec(prim_abs_path, child, depth + 1, itemmap)) {
      return false;
    }
  }

  return true;
}